

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O2

char * rapidjson::internal::u64toa(uint64_t value,char *buffer)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (value < 100000000) {
    if (9999 < value) {
      uVar2 = (uint)(ushort)((value & 0xffffffff) % 10000);
      uVar1 = (int)((value & 0xffffffff) / 1000000) * 2;
      uVar10 = (ulong)(((uint)(ushort)((value & 0xffffffff) / 10000) % 100) * 2);
      uVar5 = (uVar2 / 100) * 2;
      uVar9 = (ulong)((uVar2 % 100) * 2);
      if (value < 10000000) {
        if (999999 < value) goto LAB_0015558b;
        if (value < 100000) goto LAB_001555ad;
      }
      else {
        *buffer = GetDigitsLut()::cDigitsLut[uVar1];
        buffer = buffer + 1;
LAB_0015558b:
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar1 + 1];
        buffer = buffer + 1;
      }
      *buffer = GetDigitsLut()::cDigitsLut[uVar10];
      buffer = buffer + 1;
LAB_001555ad:
      *buffer = GetDigitsLut()::cDigitsLut[uVar10 + 1];
      buffer[1] = GetDigitsLut()::cDigitsLut[uVar5];
      buffer[2] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar5 + 1];
      buffer[3] = GetDigitsLut()::cDigitsLut[uVar9];
      buffer[4] = GetDigitsLut()::cDigitsLut[uVar9 + 1];
      return buffer + 5;
    }
    lVar4 = ((value & 0xffffffff) / 100) * 2;
    uVar9 = (ulong)(uint)((int)((value & 0xffffffff) % 100) * 2);
    if (value < 1000) {
      if (99 < value) goto LAB_0015545b;
      if (value < 10) goto LAB_0015547c;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[lVar4];
      buffer = buffer + 1;
LAB_0015545b:
      *buffer = GetDigitsLut()::cDigitsLut[lVar4 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar9];
    buffer = buffer + 1;
LAB_0015547c:
    *buffer = GetDigitsLut()::cDigitsLut[uVar9 + 1];
    return buffer + 1;
  }
  if (9999999999999999 < value) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = value;
    auVar3 = auVar3 / ZEXT816(10000000000000000);
    if (value < 100000000000000000) {
      *buffer = auVar3[0] | 0x30;
      pcVar11 = buffer + 1;
    }
    else if (value < 1000000000000000000) {
      *buffer = GetDigitsLut()::cDigitsLut[(auVar3._0_8_ & 0xffffffff) * 2];
      buffer[1] = GetDigitsLut()::cDigitsLut[(ulong)(uint)(auVar3._0_4_ * 2) + 1];
      pcVar11 = buffer + 2;
    }
    else {
      uVar7 = auVar3._0_2_;
      uVar2 = uVar7 / 100;
      if (value < 10000000000000000000) {
        *buffer = (char)uVar2 + '0';
        *(undefined2 *)(buffer + 1) =
             *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 % 100) * 2);
        pcVar11 = buffer + 3;
      }
      else {
        uVar9 = (ulong)(uVar2 * 2);
        uVar10 = (ulong)(((uint)uVar7 % 100) * 2);
        *buffer = GetDigitsLut()::cDigitsLut[uVar9];
        buffer[1] = GetDigitsLut()::cDigitsLut[uVar9 + 1];
        buffer[2] = GetDigitsLut()::cDigitsLut[uVar10];
        buffer[3] = GetDigitsLut()::cDigitsLut[uVar10 + 1];
        pcVar11 = buffer + 4;
      }
    }
    uVar9 = (value % 10000000000000000) / 100000000;
    uVar10 = (value % 10000000000000000) % 100000000;
    uVar7 = (ushort)(uVar9 % 10000);
    uVar8 = (ushort)(uVar10 % 10000);
    *(undefined2 *)pcVar11 = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar9 / 1000000) * 2);
    *(undefined2 *)(pcVar11 + 2) =
         *(undefined2 *)
          (GetDigitsLut()::cDigitsLut + (ulong)(ushort)((ushort)(uVar9 / 10000) % 100) * 2);
    *(undefined2 *)(pcVar11 + 4) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 / 100) * 2);
    *(undefined2 *)(pcVar11 + 6) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 % 100) * 2);
    *(undefined2 *)(pcVar11 + 8) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar10 / 1000000) * 2);
    *(undefined2 *)(pcVar11 + 10) =
         *(undefined2 *)
          (GetDigitsLut()::cDigitsLut + (ulong)(ushort)((ushort)(uVar10 / 10000) % 100) * 2);
    *(undefined2 *)(pcVar11 + 0xc) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar8 / 100) * 2);
    *(undefined2 *)(pcVar11 + 0xe) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar8 % 100) * 2);
    return pcVar11 + 0x10;
  }
  uVar10 = value % 100000000;
  uVar9 = value / 100000000 & 0xffffffff;
  uVar2 = (uint)(ushort)(uVar9 % 10000);
  uVar1 = (uint)(ushort)(uVar10 % 10000);
  uVar12 = (ulong)(uint)((int)((value / 100000000 & 0xffffffff) / 1000000) * 2);
  uVar5 = ((uint)(ushort)(uVar9 / 10000) % 100) * 2;
  uVar14 = (ulong)((uVar2 / 100) * 2);
  uVar13 = (ulong)((uVar2 % 100) * 2);
  uVar2 = (int)(uVar10 / 1000000) * 2;
  uVar10 = (ulong)(((uint)(ushort)(uVar10 / 10000) % 100) * 2);
  uVar6 = (uVar1 / 100) * 2;
  uVar9 = (ulong)((uVar1 % 100) * 2);
  if (value < 1000000000000000) {
    if (99999999999999 < value) goto LAB_001554a6;
    if (0x48c27394 < value >> 0xd) goto LAB_001554bb;
    if (0xe8d4a50 < value >> 0xc) goto LAB_001554cc;
    if (0x2e90edc < value >> 0xb) goto LAB_001554e1;
    if (0x9502f8 < value >> 10) goto LAB_001554f2;
    if (value < 1000000000) goto LAB_00155519;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar12];
    buffer = buffer + 1;
LAB_001554a6:
    *buffer = GetDigitsLut()::cDigitsLut[uVar12 + 1];
    buffer = buffer + 1;
LAB_001554bb:
    *buffer = GetDigitsLut()::cDigitsLut[uVar5];
    buffer = buffer + 1;
LAB_001554cc:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar5 + 1];
    buffer = buffer + 1;
LAB_001554e1:
    *buffer = GetDigitsLut()::cDigitsLut[uVar14];
    buffer = buffer + 1;
LAB_001554f2:
    *buffer = GetDigitsLut()::cDigitsLut[uVar14 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar13];
  buffer = buffer + 1;
LAB_00155519:
  *buffer = GetDigitsLut()::cDigitsLut[uVar13 + 1];
  buffer[1] = GetDigitsLut()::cDigitsLut[uVar2];
  buffer[2] = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
  buffer[3] = GetDigitsLut()::cDigitsLut[uVar10];
  buffer[4] = GetDigitsLut()::cDigitsLut[uVar10 + 1];
  buffer[5] = GetDigitsLut()::cDigitsLut[uVar6];
  buffer[6] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar6 + 1];
  buffer[7] = GetDigitsLut()::cDigitsLut[uVar9];
  buffer[8] = GetDigitsLut()::cDigitsLut[uVar9 + 1];
  return buffer + 9;
}

Assistant:

inline char* u64toa(uint64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    const char* cDigitsLut = GetDigitsLut();
    const uint64_t  kTen8 = 100000000;
    const uint64_t  kTen9 = kTen8 * 10;
    const uint64_t kTen10 = kTen8 * 100;
    const uint64_t kTen11 = kTen8 * 1000;
    const uint64_t kTen12 = kTen8 * 10000;
    const uint64_t kTen13 = kTen8 * 100000;
    const uint64_t kTen14 = kTen8 * 1000000;
    const uint64_t kTen15 = kTen8 * 10000000;
    const uint64_t kTen16 = kTen8 * kTen8;

    if (value < kTen8) {
        uint32_t v = static_cast<uint32_t>(value);
        if (v < 10000) {
            const uint32_t d1 = (v / 100) << 1;
            const uint32_t d2 = (v % 100) << 1;

            if (v >= 1000)
                *buffer++ = cDigitsLut[d1];
            if (v >= 100)
                *buffer++ = cDigitsLut[d1 + 1];
            if (v >= 10)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];
        }
        else {
            // value = bbbbcccc
            const uint32_t b = v / 10000;
            const uint32_t c = v % 10000;

            const uint32_t d1 = (b / 100) << 1;
            const uint32_t d2 = (b % 100) << 1;

            const uint32_t d3 = (c / 100) << 1;
            const uint32_t d4 = (c % 100) << 1;

            if (value >= 10000000)
                *buffer++ = cDigitsLut[d1];
            if (value >= 1000000)
                *buffer++ = cDigitsLut[d1 + 1];
            if (value >= 100000)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];

            *buffer++ = cDigitsLut[d3];
            *buffer++ = cDigitsLut[d3 + 1];
            *buffer++ = cDigitsLut[d4];
            *buffer++ = cDigitsLut[d4 + 1];
        }
    }
    else if (value < kTen16) {
        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        if (value >= kTen15)
            *buffer++ = cDigitsLut[d1];
        if (value >= kTen14)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= kTen13)
            *buffer++ = cDigitsLut[d2];
        if (value >= kTen12)
            *buffer++ = cDigitsLut[d2 + 1];
        if (value >= kTen11)
            *buffer++ = cDigitsLut[d3];
        if (value >= kTen10)
            *buffer++ = cDigitsLut[d3 + 1];
        if (value >= kTen9)
            *buffer++ = cDigitsLut[d4];

        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }
    else {
        const uint32_t a = static_cast<uint32_t>(value / kTen16); // 1 to 1844
        value %= kTen16;

        if (a < 10)
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));
        else if (a < 100) {
            const uint32_t i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else if (a < 1000) {
            *buffer++ = static_cast<char>('0' + static_cast<char>(a / 100));

            const uint32_t i = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else {
            const uint32_t i = (a / 100) << 1;
            const uint32_t j = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
            *buffer++ = cDigitsLut[j];
            *buffer++ = cDigitsLut[j + 1];
        }

        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }

    return buffer;
}